

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2shapeutil_coding.cc
# Opt level: O2

bool s2shapeutil::EncodeTaggedShapes
               (S2ShapeIndex *index,ShapeEncoder *shape_encoder,Encoder *encoder)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint32 v;
  undefined4 extraout_var;
  Encoder *this;
  ostream *this_00;
  ShapeIterator it;
  ShapeIterator local_90;
  Encoder *local_80;
  S2LogMessage local_78;
  StringVectorEncoder shape_vector;
  S2Shape *__args;
  
  local_80 = encoder;
  s2coding::StringVectorEncoder::StringVectorEncoder(&shape_vector);
  local_90.shape_id_ = 0;
  local_90.index_ = index;
  iVar2 = (*index->_vptr_S2ShapeIndex[2])(index);
  do {
    it.shape_id_ = iVar2;
    it.index_ = index;
    it._12_4_ = 0;
    bVar1 = S2ShapeIndex::ShapeIterator::operator!=(&local_90,it);
    if (!bVar1) {
      s2coding::StringVectorEncoder::Encode(&shape_vector,local_80);
      s2coding::StringVectorEncoder::~StringVectorEncoder(&shape_vector);
      return true;
    }
    iVar3 = (*(local_90.index_)->_vptr_S2ShapeIndex[3])
                      (local_90.index_,(ulong)(uint)local_90.shape_id_);
    __args = (S2Shape *)CONCAT44(extraout_var,iVar3);
    this = s2coding::StringVectorEncoder::AddViaEncoder(&shape_vector);
    if (__args != (S2Shape *)0x0) {
      v = (*__args->_vptr_S2Shape[10])(__args);
      if (v == 0) {
        S2LogMessage::S2LogMessage
                  (&local_78,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2shapeutil_coding.cc"
                   ,0xa8,kFatal,(ostream *)&std::cerr);
        this_00 = std::operator<<(local_78.stream_,"Unsupported S2Shape type: ");
        std::ostream::operator<<(this_00,0);
        abort();
      }
      Encoder::Ensure(this,5);
      Encoder::put_varint32(this,v);
      std::function<bool_(const_S2Shape_&,_Encoder_*)>::operator()(shape_encoder,__args,this);
    }
    local_90.shape_id_ = local_90.shape_id_ + 1;
  } while( true );
}

Assistant:

bool EncodeTaggedShapes(const S2ShapeIndex& index,
                        const ShapeEncoder& shape_encoder,
                        Encoder* encoder) {
  s2coding::StringVectorEncoder shape_vector;
  for (S2Shape* shape : index) {
    Encoder* sub_encoder = shape_vector.AddViaEncoder();
    if (shape == nullptr) continue;  // Encode as zero bytes.

    uint32 tag = shape->type_tag();
    if (tag == S2Shape::kNoTypeTag) {
      S2_LOG(DFATAL) << "Unsupported S2Shape type: " << tag;
      return false;
    }
    sub_encoder->Ensure(Encoder::kVarintMax32);
    sub_encoder->put_varint32(tag);
    shape_encoder(*shape, sub_encoder);
  }
  shape_vector.Encode(encoder);
  return true;
}